

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

vector<mjs::value,_std::allocator<mjs::value>_> * __thiscall
mjs::bound_function_args::build_args
          (vector<mjs::value,_std::allocator<mjs::value>_> *__return_storage_ptr__,
          bound_function_args *this,vector<mjs::value,_std::allocator<mjs::value>_> *extra_args)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  value_representation *this_00;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_> local_78;
  const_iterator local_70;
  value local_68;
  uint local_40;
  uint32_t i;
  gc_vector<mjs::value_representation> *local_30;
  gc_vector<mjs::value_representation> *ba;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_20;
  vector<mjs::value,_std::allocator<mjs::value>_> *extra_args_local;
  bound_function_args *this_local;
  vector<mjs::value,_std::allocator<mjs::value>_> *res;
  
  local_20 = extra_args;
  extra_args_local = (vector<mjs::value,_std::allocator<mjs::value>_> *)this;
  this_local = (bound_function_args *)__return_storage_ptr__;
  bVar2 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                    ((gc_heap_ptr_untracked *)&this->bound_args_);
  if (bVar2) {
    ba._7_1_ = 0;
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(__return_storage_ptr__);
    local_30 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::dereference
                         (&this->bound_args_,this->heap_);
    for (local_40 = 0; uVar1 = local_40,
        uVar3 = gc_vector<mjs::value_representation>::length(local_30), uVar1 < uVar3;
        local_40 = local_40 + 1) {
      this_00 = gc_vector<mjs::value_representation>::operator[](local_30,local_40);
      value_representation::get_value(&local_68,this_00,this->heap_);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::push_back
                (__return_storage_ptr__,&local_68);
      value::~value(&local_68);
    }
    local_78._M_current =
         (value *)std::vector<mjs::value,_std::allocator<mjs::value>_>::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<mjs::value_const*,std::vector<mjs::value,std::allocator<mjs::value>>>::
    __normal_iterator<mjs::value*>
              ((__normal_iterator<mjs::value_const*,std::vector<mjs::value,std::allocator<mjs::value>>>
                *)&local_70,&local_78);
    __first = std::vector<mjs::value,_std::allocator<mjs::value>_>::begin(local_20);
    __last = std::vector<mjs::value,_std::allocator<mjs::value>_>::end(local_20);
    std::vector<mjs::value,std::allocator<mjs::value>>::
    insert<__gnu_cxx::__normal_iterator<mjs::value_const*,std::vector<mjs::value,std::allocator<mjs::value>>>,void>
              ((vector<mjs::value,std::allocator<mjs::value>> *)__return_storage_ptr__,local_70,
               (__normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                )__first._M_current,
               (__normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                )__last._M_current);
  }
  else {
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(__return_storage_ptr__,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value> build_args(const std::vector<value>& extra_args) const {
        if (!bound_args_) {
            return extra_args;
        }
        std::vector<value> res;
        auto& ba = bound_args_.dereference(heap_);
        for (uint32_t i = 0; i < ba.length(); ++i) {
            res.push_back(ba[i].get_value(heap_));
        }
        res.insert(res.end(), extra_args.begin(), extra_args.end());
        return res;
    }